

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O1

void __thiscall
level_aux_mesh::build(level_aux_mesh *this,xr_level_som *som,xr_gamemtls_lib *gamemtls_lib)

{
  float *pfVar1;
  b_face_vec *this_00;
  pointer *ppbVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  iterator __position;
  long lVar6;
  ulong uVar7;
  pointer ppxVar8;
  ulong uVar9;
  pointer ppxVar10;
  som_poly *psVar11;
  som_poly *psVar12;
  uint32_t face_idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> refs;
  xr_gamemtl_vec gamemtls;
  b_face face_template;
  xr_gamemtl pattern;
  uint local_120;
  uint local_11c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_> local_100;
  anon_union_48_3_fb61167d_for_b_face_0 local_e8;
  undefined4 uStack_b8;
  undefined2 uStack_b4;
  short sStack_b2;
  undefined4 uStack_b0;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  float local_3c;
  
  std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::vector
            (&local_100,&gamemtls_lib->m_materials);
  ppxVar8 = local_100.
            super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppxVar10 = local_100.
             super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (local_100.super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_100.super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = (long)local_100.
                  super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_100.
                  super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar6 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<xray_re::xr_gamemtl**,std::vector<xray_re::xr_gamemtl*,std::allocator<xray_re::xr_gamemtl*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<sound_occ_pred>>
              (local_100.
               super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_100.
               super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<xray_re::xr_gamemtl**,std::vector<xray_re::xr_gamemtl*,std::allocator<xray_re::xr_gamemtl*>>>,__gnu_cxx::__ops::_Iter_comp_iter<sound_occ_pred>>
              (ppxVar10,ppxVar8);
  }
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  local_80 = &local_70;
  local_78 = 0;
  local_70 = 0;
  local_120 = 0;
  local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_118,(ulong)(som->m_num_polys * 3));
  this_00 = &(this->super_xr_mesh_builder).m_faces;
  std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
  reserve(this_00,(ulong)som->m_num_polys);
  uStack_b0 = 0xffffffff;
  uStack_aa = 0;
  local_e8.field_0.v[0] = 0xffffffff;
  local_e8.field_0.v[1] = 0xffffffff;
  local_e8.field_0.v[2] = 0xffffffff;
  local_e8.field_0.n[0] = 0xffffffff;
  local_e8.field_0.n[1] = 0xffffffff;
  local_e8.field_0.n[2] = 0xffffffff;
  local_e8.field_0.tc[0] = 0xffffffff;
  local_e8.field_0.tc[1] = 0xffffffff;
  local_e8.field_0.tc[2] = 0xffffffff;
  local_e8.field_0.link[0] = 0xffffffff;
  local_e8.field_0.link[1] = 0xffffffff;
  local_e8.field_0.link[2]._0_2_ = 0xffff;
  local_e8.field_0.link[2]._2_2_ = 0xffff;
  uStack_b8 = 0xffffffff;
  uStack_b4 = 0xffff;
  sStack_b2 = 0;
  if ((ulong)som->m_num_polys != 0) {
    psVar12 = som->m_polys;
    psVar11 = psVar12 + som->m_num_polys;
    do {
      fVar3 = *(float *)&psVar12->field_0;
      fVar4 = *(float *)((long)&psVar12->field_0 + 0xc);
      if ((((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) ||
          (fVar5 = *(float *)((long)&psVar12->field_0 + 4),
          pfVar1 = (float *)((long)&psVar12->field_0 + 0x10), fVar5 != *pfVar1)) ||
         (NAN(fVar5) || NAN(*pfVar1))) {
LAB_00123912:
        fVar5 = *(float *)((long)&psVar12->field_0 + 0x18);
        if ((fVar3 == fVar5) && (!NAN(fVar3) && !NAN(fVar5))) {
          fVar3 = *(float *)((long)&psVar12->field_0 + 4);
          pfVar1 = (float *)((long)&psVar12->field_0 + 0x1c);
          if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) {
            fVar3 = *(float *)((long)&psVar12->field_0 + 8);
            pfVar1 = (float *)((long)&psVar12->field_0 + 0x20);
            if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) goto LAB_00123ad5;
          }
        }
        if ((fVar4 == fVar5) && (!NAN(fVar4) && !NAN(fVar5))) {
          fVar3 = *(float *)((long)&psVar12->field_0 + 0x10);
          pfVar1 = (float *)((long)&psVar12->field_0 + 0x1c);
          if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) {
            fVar3 = *(float *)((long)&psVar12->field_0 + 0x14);
            pfVar1 = (float *)((long)&psVar12->field_0 + 0x20);
            if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) goto LAB_00123ad5;
          }
        }
        if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_118,
                     (iterator)
                     local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_120);
        }
        else {
          *local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_120;
          local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_11c = local_120 | 1;
        if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_118,
                     (iterator)
                     local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_11c);
        }
        else {
          *local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_11c;
          local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_11c = local_120 | 2;
        if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_118,
                     (iterator)
                     local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_11c);
        }
        else {
          *local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_11c;
          local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_120 = local_120 + 4;
        local_3c = psVar12->occ;
        uVar9 = (long)local_100.
                      super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_100.
                      super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
        ppxVar10 = local_100.
                   super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        while (uVar7 = uVar9, 0 < (long)uVar7) {
          uVar9 = uVar7 >> 1;
          if (ppxVar10[uVar9]->snd_occlusion_factor <= local_3c &&
              local_3c != ppxVar10[uVar9]->snd_occlusion_factor) {
            ppxVar10 = ppxVar10 + uVar9 + 1;
            uVar9 = ~uVar9 + uVar7;
          }
        }
        if (ppxVar10 ==
            local_100.
            super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_00123b8c:
          __assert_fail("gamemtl_it != gamemtls.end() && (*gamemtl_it)->snd_occlusion_factor == it->occ"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_aux_mesh.cxx"
                        ,0x62,
                        "void level_aux_mesh::build(const xr_level_som &, const xr_gamemtls_lib &)")
          ;
        }
        fVar3 = (*ppxVar10)->snd_occlusion_factor;
        if ((fVar3 != local_3c) || (NAN(fVar3) || NAN(local_3c))) goto LAB_00123b8c;
        uStack_b4 = (undefined2)(*ppxVar10)->id;
        sStack_b2 = (ushort)(psVar12->b2sided != 0) << 3;
        uStack_b8 = 0;
        __position._M_current =
             (this->super_xr_mesh_builder).m_faces.
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->super_xr_mesh_builder).m_faces.
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>
          ::_M_realloc_insert<xray_re::xr_mesh_builder::b_face_const&>
                    ((vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>
                      *)this_00,__position,(b_face *)&local_e8.field_0);
        }
        else {
          (__position._M_current)->field_1 =
               (anon_union_8_2_d279a524_for_b_face_2)((ulong)CONCAT22(sStack_b2,uStack_b4) << 0x20);
          (__position._M_current)->tag = uStack_b0;
          (__position._M_current)->temp = uStack_ac;
          (__position._M_current)->sector = uStack_aa;
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x20) =
               CONCAT44(local_e8.field_0.link[0],local_e8.field_0.tc[2]);
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x28) =
               CONCAT26(local_e8.field_0.link[2]._2_2_,
                        CONCAT24(local_e8.field_0.link[2]._0_2_,local_e8.field_0.link[1]));
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x10) =
               CONCAT44(local_e8.field_0.n[2],local_e8.field_0.n[1]);
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x18) =
               CONCAT44(local_e8.field_0.tc[1],local_e8.field_0.tc[0]);
          *(ulong *)&(__position._M_current)->field_0 =
               CONCAT44(local_e8.field_0.v[1],local_e8.field_0.v[0]);
          *(ulong *)((long)&(__position._M_current)->field_0 + 8) =
               CONCAT44(local_e8.field_0.n[0],local_e8.field_0.v[2]);
          ppbVar2 = &(this->super_xr_mesh_builder).m_faces.
                     super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppbVar2 = *ppbVar2 + 1;
        }
      }
      else {
        fVar5 = *(float *)((long)&psVar12->field_0 + 8);
        pfVar1 = (float *)((long)&psVar12->field_0 + 0x14);
        if ((fVar5 != *pfVar1) || (NAN(fVar5) || NAN(*pfVar1))) goto LAB_00123912;
      }
LAB_00123ad5:
      psVar12 = psVar12 + 1;
    } while (psVar12 != psVar11);
  }
  if (local_120 != 0) {
    compact_vertices<xray_re::som_poly>(this,&local_118,som->m_polys);
    create_uvs(this);
  }
  if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if (local_100.super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void level_aux_mesh::build(const xr_level_som& som, const xr_gamemtls_lib& gamemtls_lib)
{
	xr_gamemtl_vec gamemtls(gamemtls_lib.materials());
	std::sort(gamemtls.begin(), gamemtls.end(), sound_occ_pred());

	xr_gamemtl pattern;

	uint32_t face_idx = 0;

	std::vector<uint32_t> refs;
	refs.reserve(3*som.num_polys());
	m_faces.reserve(som.num_polys());
	b_face face_template;
	for (const som_poly *it = som.polys(), *end = it + som.num_polys(); it != end; ++it) {
		if (it->v0 == it->v1 || it->v0 == it->v2 || it->v1 == it->v2)
			continue;
		refs.push_back(face_idx);
		refs.push_back(face_idx | 1);
		refs.push_back(face_idx | 2);
		face_idx += 4;
		pattern.snd_occlusion_factor = it->occ;
		xr_gamemtl_vec_cit gamemtl_it = std::lower_bound(gamemtls.begin(), gamemtls.end(),
				&pattern, sound_occ_pred());
		xr_assert(gamemtl_it != gamemtls.end() && (*gamemtl_it)->snd_occlusion_factor == it->occ);
		face_template.surface.set(0, 0, (*gamemtl_it)->id, it->b2sided ? RSF_TWO_SIDED : 0);
		m_faces.push_back(face_template);
	}
	if (face_idx) {
		compact_vertices(refs, som.polys());
		create_uvs();
	}
}